

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_WriteCell(FILE *pFile)

{
  fwrite(".model cell\n",0xc,1,(FILE *)pFile);
  fwrite(".inputs px1 px2 py1 py2 x y\n",0x1c,1,(FILE *)pFile);
  fwrite(".outputs fx fy\n",0xf,1,(FILE *)pFile);
  fwrite(".names x y a\n",0xd,1,(FILE *)pFile);
  fwrite("11 1\n",5,1,(FILE *)pFile);
  fwrite(".names px1 a x nx\n",0x12,1,(FILE *)pFile);
  fwrite("11- 1\n",6,1,(FILE *)pFile);
  fwrite("0-1 1\n",6,1,(FILE *)pFile);
  fwrite(".names py1 a y ny\n",0x12,1,(FILE *)pFile);
  fwrite("11- 1\n",6,1,(FILE *)pFile);
  fwrite("0-1 1\n",6,1,(FILE *)pFile);
  fwrite(".names px2 nx fx\n",0x11,1,(FILE *)pFile);
  fwrite("10 1\n",5,1,(FILE *)pFile);
  fwrite("01 1\n",5,1,(FILE *)pFile);
  fwrite(".names py2 ny fy\n",0x11,1,(FILE *)pFile);
  fwrite("10 1\n",5,1,(FILE *)pFile);
  fwrite("01 1\n",5,1,(FILE *)pFile);
  fwrite(".end\n",5,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Abc_WriteCell( FILE * pFile )
{
    fprintf( pFile, ".model cell\n" );
    fprintf( pFile, ".inputs px1 px2 py1 py2 x y\n" ); 
    fprintf( pFile, ".outputs fx fy\n" ); 
    fprintf( pFile, ".names x y a\n" ); 
    fprintf( pFile, "11 1\n" ); 
    fprintf( pFile, ".names px1 a x nx\n" ); 
    fprintf( pFile, "11- 1\n" ); 
    fprintf( pFile, "0-1 1\n" ); 
    fprintf( pFile, ".names py1 a y ny\n" ); 
    fprintf( pFile, "11- 1\n" ); 
    fprintf( pFile, "0-1 1\n" ); 
    fprintf( pFile, ".names px2 nx fx\n" ); 
    fprintf( pFile, "10 1\n" ); 
    fprintf( pFile, "01 1\n" ); 
    fprintf( pFile, ".names py2 ny fy\n" ); 
    fprintf( pFile, "10 1\n" ); 
    fprintf( pFile, "01 1\n" ); 
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}